

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

value_type * __thiscall
mxx::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
          (value_type *__return_storage_ptr__,
          future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  type pbVar1;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  impl::
  future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  wait(&this->
        super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ,this);
  (this->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_valid = false;
  pbVar1 = std::
           unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&this->m_data);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  return __return_storage_ptr__;
}

Assistant:

value_type get() {
        this->wait();
        this->m_valid = false;
        return std::move(*m_data);
    }